

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

bool QObject::disconnect(QObject *sender,char *signal,QObject *receiver,char *method)

{
  QMetaObject *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  QMetaObjectPrivate *this;
  QArgumentType *in_R9;
  char *method_00;
  byte *signature;
  long in_FS_OFFSET;
  QByteArrayView name;
  QByteArrayView name_00;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QMetaObject *smeta;
  QArgumentTypeArray methodTypes;
  QArgumentTypeArray signalTypes;
  byte *local_368;
  QArrayData *local_358;
  QArrayData *local_340;
  storage_type *local_328;
  QMetaObject **local_320;
  QMetaObject *local_2f0;
  undefined1 local_2e8 [344];
  undefined1 local_190 [344];
  long local_38;
  undefined4 extraout_var_00;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sender == (QObject *)0x0) || (method != (char *)0x0 && receiver == (QObject *)0x0)) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      disconnect();
    }
    bVar2 = false;
    goto LAB_002b83f9;
  }
  if (signal == (char *)0x0) {
    local_358 = (QArrayData *)0x0;
    local_368 = (byte *)0x0;
LAB_002b84b3:
    if (method == (char *)0x0) {
      local_340 = (QArrayData *)0x0;
      signature = (byte *)0x0;
LAB_002b8522:
      iVar6 = (**sender->_vptr_QObject)();
      local_2f0 = (QMetaObject *)CONCAT44(extraout_var,iVar6);
      memset(local_190,0xaa,0x158);
      local_190._0_8_ = (QArrayData *)0xa;
      local_190._8_8_ = (byte *)0x0;
      local_190._16_8_ = local_190 + 0x18;
      if (local_368 == (byte *)0x0) {
        QVar9 = (QByteArrayView)ZEXT816(0);
      }
      else {
        QVar9 = QMetaObjectPrivate::decodeMethodSignature
                          ((char *)local_368,(QArgumentTypeArray *)local_190);
      }
      memset(local_2e8,0xaa,0x158);
      local_2e8._0_8_ = 10;
      local_2e8._8_8_ = 0;
      local_2e8._16_8_ = local_2e8 + 0x18;
      if (signature == (byte *)0x0) {
        QVar10 = (QByteArrayView)ZEXT816(0);
      }
      else {
        QVar10 = QMetaObjectPrivate::decodeMethodSignature
                           ((char *)signature,(QArgumentTypeArray *)local_2e8);
      }
      bVar2 = false;
      bVar4 = false;
      bVar3 = false;
      do {
        local_328 = QVar9.m_data;
        local_320 = (QMetaObject **)QVar9.m_size;
        if (local_368 == (byte *)0x0) {
          iVar6 = -1;
LAB_002b868f:
          if (signature == (byte *)0x0) {
            in_R9 = (QArgumentType *)0x0;
            bVar5 = QMetaObjectPrivate::disconnect
                              (sender,iVar6,local_2f0,receiver,-1,(void **)0x0,DisconnectAll);
            bVar2 = (bool)(bVar2 | bVar5);
            bVar5 = false;
          }
          else {
            iVar7 = (**receiver->_vptr_QObject)(receiver);
            this = (QMetaObjectPrivate *)CONCAT44(extraout_var_00,iVar7);
            do {
              name_00.m_data._0_4_ = local_2e8._8_4_;
              name_00.m_size = (qsizetype)QVar10.m_data;
              name_00.m_data._4_4_ = 0;
              iVar7 = QMetaObjectPrivate::indexOfMethod
                                (this,(QMetaObject *)QVar10.m_size,name_00,(int)local_2e8._16_8_,
                                 in_R9);
              if (-1 < iVar7) {
                while (iVar8 = QMetaObject::methodOffset((QMetaObject *)this), iVar7 < iVar8) {
                  this = *(QMetaObjectPrivate **)this;
                }
              }
              if (iVar7 < 0) break;
              in_R9 = (QArgumentType *)0x0;
              bVar4 = QMetaObjectPrivate::disconnect
                                (sender,iVar6,local_2f0,receiver,iVar7,(void **)0x0,DisconnectAll);
              bVar2 = (bool)(bVar2 | bVar4);
              bVar4 = true;
              this = *(QMetaObjectPrivate **)this;
            } while (this != (QMetaObjectPrivate *)0x0);
            bVar5 = false;
          }
        }
        else {
          name.m_data._0_4_ = local_190._8_4_;
          name.m_size = (qsizetype)local_328;
          name.m_data._4_4_ = 0;
          iVar6 = QMetaObjectPrivate::indexOfSignalRelative
                            ((QMetaObjectPrivate *)&local_2f0,local_320,name,(int)local_190._16_8_,
                             in_R9);
          if (-1 < iVar6) {
            iVar7 = QMetaObjectPrivate::originalClone(local_2f0,iVar6);
            iVar6 = 0;
            for (pQVar1 = (local_2f0->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
                pQVar1 = (pQVar1->d).superdata.direct) {
              iVar6 = iVar6 + (pQVar1->d).data[0xd];
            }
            iVar6 = iVar6 + iVar7;
            bVar3 = true;
            goto LAB_002b868f;
          }
          bVar5 = true;
        }
      } while (((local_368 != (byte *)0x0) && (!bVar5)) &&
              (local_2f0 = (local_2f0->d).superdata.direct, local_2f0 != (QMetaObject *)0x0));
      if ((local_368 == (byte *)0x0) || (bVar3)) {
        if ((signature != (byte *)0x0) && (!bVar4)) {
          err_method_notfound(receiver,method,"disconnect");
          goto LAB_002b87d2;
        }
      }
      else {
        err_method_notfound(sender,signal,"disconnect");
LAB_002b87d2:
        err_info_about_objects("disconnect",sender,receiver);
      }
      if ((local_368 == (byte *)0x0) && (bVar2 != false)) {
        (*sender->_vptr_QObject[0xb])();
      }
      std::_Destroy_n_aux<false>::__destroy_n<QArgumentType*,long_long>
                ((QArgumentType *)local_2e8._16_8_,local_2e8._8_8_);
      if ((QArgumentType *)local_2e8._16_8_ != (QArgumentType *)(local_2e8 + 0x18)) {
        QtPrivate::sizedFree((void *)local_2e8._16_8_,local_2e8._0_8_ << 5);
      }
      std::_Destroy_n_aux<false>::__destroy_n<QArgumentType*,long_long>
                ((QArgumentType *)local_190._16_8_,local_190._8_8_);
      if ((QArgumentType *)local_190._16_8_ != (QArgumentType *)(local_190 + 0x18)) {
        QtPrivate::sizedFree((void *)local_190._16_8_,local_190._0_8_ << 5);
      }
    }
    else {
      QMetaObject::normalizedSignature((QByteArray *)local_190,method);
      method_00 = (char *)local_190._8_8_;
      if ((byte *)local_190._8_8_ == (byte *)0x0) {
        method_00 = "";
      }
      local_340 = (QArrayData *)local_190._0_8_;
      bVar2 = check_method_code((byte)*method_00 & 3,receiver,method_00,"disconnect");
      if (bVar2) {
        signature = (byte *)method_00 + 1;
        goto LAB_002b8522;
      }
      bVar2 = false;
    }
    if (local_340 != (QArrayData *)0x0) {
      LOCK();
      (local_340->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_340->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_340->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_340,1,0x10);
      }
    }
  }
  else {
    QMetaObject::normalizedSignature((QByteArray *)local_190,signal);
    local_368 = (byte *)local_190._8_8_;
    if ((byte *)local_190._8_8_ == (byte *)0x0) {
      local_368 = (byte *)0x4e8460;
    }
    local_358 = (QArrayData *)local_190._0_8_;
    bVar2 = check_signal_macro(sender,(char *)local_368,"disconnect","unbind");
    if (bVar2) {
      local_368 = local_368 + 1;
      goto LAB_002b84b3;
    }
    bVar2 = false;
  }
  if (local_358 != (QArrayData *)0x0) {
    LOCK();
    (local_358->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_358->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_358->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_358,1,0x10);
    }
  }
LAB_002b83f9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QObject::disconnect(const QObject *sender, const char *signal,
                         const QObject *receiver, const char *method)
{
    if (sender == nullptr || (receiver == nullptr && method != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }

    const char *signal_arg = signal;
    QByteArray signal_name;
    bool signal_found = false;
    if (signal) {
        QT_TRY {
            signal_name = QMetaObject::normalizedSignature(signal);
            signal = signal_name.constData();
        } QT_CATCH (const std::bad_alloc &) {
            // if the signal is already normalized, we can continue.
            if (sender->metaObject()->indexOfSignal(signal + 1) == -1)
                QT_RETHROW;
        }

        if (!check_signal_macro(sender, signal, "disconnect", "unbind"))
            return false;
        signal++; // skip code
    }